

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O1

void __thiscall
rengine::Signal<>::disconnect(Signal<> *this,SignalEmitter *emitter,SignalHandler<> *handler)

{
  SignalBase *__src;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *pvVar1;
  SignalBase *pSVar2;
  pointer ppBVar3;
  __normal_iterator<rengine::SignalHandler<>_**,_std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>_>
  __dest;
  BucketBase *pBVar4;
  SignalHandler<> *local_18;
  SignalHandler<> *handler_local;
  
  pvVar1 = emitter->m_buckets;
  if (pvVar1 != (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                 *)0x0) {
    for (ppBVar3 = (pvVar1->
                   super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppBVar3 !=
        (pvVar1->
        super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        )._M_impl.super__Vector_impl_data._M_finish; ppBVar3 = ppBVar3 + 1) {
      pBVar4 = *ppBVar3;
      if (pBVar4->signal == &this->super_SignalBase) goto LAB_0016b1e3;
    }
  }
  pBVar4 = (BucketBase *)0x0;
LAB_0016b1e3:
  local_18 = handler;
  if (pBVar4 == (BucketBase *)0x0) {
    __assert_fail("bucket",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/object/signal.h"
                  ,0x74,
                  "void rengine::Signal<>::disconnect(SignalEmitter *, SignalHandler<Arguments...> *) [Arguments = <>]"
                 );
  }
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<rengine::SignalHandler<>**,std::vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>>>,__gnu_cxx::__ops::_Iter_equals_val<rengine::SignalHandler<>*const>>
                     (pBVar4[1]._vptr_BucketBase,pBVar4[1].signal,&local_18);
  pSVar2 = pBVar4[1].signal;
  if ((SignalBase *)__dest._M_current == pSVar2) {
    __assert_fail("pos != bucket->handlers.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/object/signal.h"
                  ,0x76,
                  "void rengine::Signal<>::disconnect(SignalEmitter *, SignalHandler<Arguments...> *) [Arguments = <>]"
                 );
  }
  __src = (SignalBase *)(__dest._M_current + 1);
  if (__src != pSVar2) {
    memmove(__dest._M_current,__src,(long)pSVar2 - (long)__src);
  }
  pBVar4[1].signal = pBVar4[1].signal + -8;
  return;
}

Assistant:

void disconnect(SignalEmitter *emitter, SignalHandler<Arguments ...> *handler)
    {
        Bucket *bucket = findBucket(emitter);
        assert(bucket);
        auto pos = std::find(bucket->handlers.begin(), bucket->handlers.end(), handler);
        assert(pos != bucket->handlers.end());
        bucket->handlers.erase(pos);
    }